

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Attack(Player *this,Player *target,string *prov)

{
  int ap_00;
  Type TVar1;
  int iVar2;
  Item *pIVar3;
  ostream *poVar4;
  int local_74;
  int dp;
  int ap;
  string local_60 [32];
  Item *local_40;
  BlackCard *prTarget;
  Item *item;
  Personality *pers;
  iterator it;
  string *prov_local;
  Player *target_local;
  Player *this_local;
  
  it._M_node = (_List_node_base *)prov;
  std::_List_iterator<BlackCard_*>::_List_iterator((_List_iterator<BlackCard_*> *)&pers);
  std::__cxx11::string::string(local_60,(string *)prov);
  pIVar3 = (Item *)DynastyDeck::findTarget(&target->provinces,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  local_40 = pIVar3;
  if (pIVar3 == (Item *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Invalid target province");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    ap_00 = DynastyDeck::calculateAttackPoints(&this->army);
    local_74 = DynastyDeck::calculateDefensePoints(&target->army);
    TVar1 = Card::getType((Card *)local_40);
    if (TVar1 == PERSONALITY) {
      item = local_40;
      iVar2 = Personality::getDefense((Personality *)local_40);
      local_74 = iVar2 + local_74;
    }
    if (local_74 < ap_00) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Attack successful");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      DynastyDeck::popCard(&target->provinces,(BlackCard *)local_40);
      TVar1 = Card::getType((Card *)local_40);
      if (TVar1 == PERSONALITY) {
        if (item != (Item *)0x0) {
          (*(item->super_GreenCard).super_Card._vptr_Card[3])();
        }
      }
      else if (prTarget != (BlackCard *)0x0) {
        (*(prTarget->super_Card)._vptr_Card[3])();
      }
      DynastyDeck::BattleConsequences(&target->army,false,false,ap_00,local_74);
      DynastyDeck::BattleConsequences(&this->army,true,true,ap_00,local_74);
      if (local_40 != (Item *)0x0) {
        (*(local_40->super_GreenCard).super_Card._vptr_Card[3])();
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Province destroyed");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (ap_00 == local_74) {
      DynastyDeck::BattleConsequences(&target->army,false,false,ap_00,local_74);
      DynastyDeck::BattleConsequences(&this->army,true,false,ap_00,local_74);
      poVar4 = std::operator<<((ostream *)&std::cout,"Draw");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      DynastyDeck::BattleConsequences(&target->army,false,true,ap_00,local_74);
      DynastyDeck::BattleConsequences(&this->army,true,false,ap_00,local_74);
      poVar4 = std::operator<<((ostream *)&std::cout,"Attack unsuccessful");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Player::Attack(Player * target, string prov)
{
    list<BlackCard*>::iterator it;

    Personality * pers;
    Item * item;

    BlackCard *prTarget = target->provinces.findTarget(prov);
    if (!prTarget)
    {
        cout << "Invalid target province"<<endl;
        return;
    }

    int ap = army.calculateAttackPoints();
    int dp = target->army.calculateDefensePoints();        //without provinces initial defense

    if (prTarget->getType() == Card::PERSONALITY) //all followers and items associated with personalities are deleted by their constructor
    {
        pers = reinterpret_cast<Personality *>(prTarget);
        dp += pers->getDefense();
    }

    if (ap > dp)
    {
        cout << "Attack successful"<<endl;

        //destroy province of target
        target->provinces.popCard(prTarget);

        if (prTarget->getType() == Card::PERSONALITY)
            delete pers;
        else
            delete item;

        target->army.BattleConsequences(false, false, ap, dp);                   //destroy associated army of target
        this->army.BattleConsequences(true, true, ap, dp);                       //change attacking army

        delete prTarget;
        cout << "Province destroyed"<<endl;
    }
    else if (ap == dp)
    {
        //destroy all attacking and defending armies
        target->army.BattleConsequences(false, false, ap, dp);
        this->army.BattleConsequences(true, false, ap, dp);
        cout << "Draw"<<endl;
    }
    else
    {
        target->army.BattleConsequences(false, true, ap, dp);                   //change associated army of target
        this->army.BattleConsequences(true, false, ap, dp);                     //destroy attacking army
        cout << "Attack unsuccessful"<<endl;
    }
}